

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIError.cpp
# Opt level: O2

void __thiscall
glcts::TextureBorderClampSamplerParameterIErrorTest::VerifyGLGetSamplerParameterIuiv
          (TextureBorderClampSamplerParameterIErrorTest *this,GLuint sampler_id,GLenum pname,
          GLenum expected_error)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  char *pcVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> params;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar1 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&params,0x20,(allocator_type *)local_1b0);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa40))
            (sampler_id,pname,
             params.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected_error) {
    this->m_test_passed = '\0';
    local_1b0._0_8_ =
         ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"glGetSamplerParameterIuivEXT() failed:[");
    std::operator<<((ostream *)this_00,"sampler id:");
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::operator<<((ostream *)this_00,", pname:");
    pcVar3 = TextureBorderClampBase::getPNameString(&this->super_TextureBorderClampBase,pname);
    std::operator<<((ostream *)this_00,pcVar3);
    std::operator<<((ostream *)this_00,"] reported error code:[");
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,"] expected error code:[");
    local_1d0.m_getName = glu::getErrorName;
    local_1d0.m_value = expected_error;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,"]\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&params.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void TextureBorderClampSamplerParameterIErrorTest::VerifyGLGetSamplerParameterIuiv(glw::GLuint sampler_id,
																				   glw::GLenum pname,
																				   glw::GLenum expected_error)
{
	glw::GLenum				 error_code = GL_NO_ERROR;
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	std::vector<glw::GLuint> params(m_buffer_size);

	gl.getSamplerParameterIuiv(sampler_id, pname, &params[0]);

	error_code = gl.getError();
	if (expected_error != error_code)
	{
		m_test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glGetSamplerParameterIuivEXT() failed:["
						   << "sampler id:" << sampler_id << ", pname:" << getPNameString(pname)
						   << "] reported error code:[" << glu::getErrorStr(error_code) << "] expected error code:["
						   << glu::getErrorStr(expected_error) << "]\n"
						   << tcu::TestLog::EndMessage;
	}
}